

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFTokenizer.cc
# Opt level: O3

bool __thiscall anon_unknown.dwarf_6d9cde::QPDFWordTokenFinder::check(QPDFWordTokenFinder *this)

{
  InputSource *input;
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  qpdf_offset_t qVar3;
  undefined4 extraout_var_00;
  string *context;
  byte bVar4;
  bool bVar5;
  char next;
  Tokenizer tokenizer;
  long *local_d8 [2];
  long local_c8 [2];
  Tokenizer local_b8;
  
  ::qpdf::Tokenizer::Tokenizer(&local_b8);
  input = this->is;
  local_d8[0] = local_c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"finder","");
  ::qpdf::Tokenizer::nextToken(&local_b8,input,context,(this->str)._M_string_length + 2);
  if (local_d8[0] != local_c8) {
    operator_delete(local_d8[0],local_c8[0] + 1);
  }
  iVar1 = (*this->is->_vptr_InputSource[4])();
  if ((local_b8.type == tt_word) &&
     (local_b8.raw_val._M_string_length == (this->str)._M_string_length)) {
    if (local_b8.raw_val._M_string_length != 0) {
      iVar2 = bcmp(local_b8.raw_val._M_dataplus._M_p,(this->str)._M_dataplus._M_p,
                   local_b8.raw_val._M_string_length);
      if (iVar2 != 0) goto LAB_001e5896;
    }
    qVar3 = InputSource::getLastOffset(this->is);
    iVar2 = (*this->is->_vptr_InputSource[7])(this->is,local_d8,1);
    bVar4 = 1;
    if (CONCAT44(extraout_var_00,iVar2) != 0) {
      if (((0x3e < ((ulong)local_d8[0] & 0xff)) ||
          ((0x5000832100003e01U >> ((ulong)local_d8[0] & 0x3f) & 1) == 0)) &&
         ((0x22 < (byte)local_d8[0]._0_1_ - 0x5b ||
          ((0x500000005U >> ((ulong)((byte)local_d8[0]._0_1_ - 0x5b) & 0x3f) & 1) == 0)))) {
        bVar4 = 0;
      }
    }
    (*this->is->_vptr_InputSource[5])(this->is,CONCAT44(extraout_var,iVar1),0);
    bVar5 = (bool)(bVar4 & qVar3 != 0);
  }
  else {
LAB_001e5896:
    bVar5 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8.error_message._M_dataplus._M_p != &local_b8.error_message.field_2) {
    operator_delete(local_b8.error_message._M_dataplus._M_p,
                    local_b8.error_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8.raw_val._M_dataplus._M_p != &local_b8.raw_val.field_2) {
    operator_delete(local_b8.raw_val._M_dataplus._M_p,
                    local_b8.raw_val.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8.val._M_dataplus._M_p != &local_b8.val.field_2) {
    operator_delete(local_b8.val._M_dataplus._M_p,local_b8.val.field_2._M_allocated_capacity + 1);
  }
  return bVar5;
}

Assistant:

bool
QPDFWordTokenFinder::check()
{
    // Find a word token matching the given string, preceded by a delimiter, and followed by a
    // delimiter or EOF.
    Tokenizer tokenizer;
    tokenizer.nextToken(is, "finder", str.size() + 2);
    qpdf_offset_t pos = is.tell();
    if (tokenizer.getType() != tt::tt_word || tokenizer.getValue() != str) {
        QTC::TC("qpdf", "QPDFTokenizer finder found wrong word");
        return false;
    }
    qpdf_offset_t token_start = is.getLastOffset();
    char next;
    bool next_okay = false;
    if (is.read(&next, 1) == 0) {
        QTC::TC("qpdf", "QPDFTokenizer inline image at EOF");
        next_okay = true;
    } else {
        next_okay = is_delimiter(next);
    }
    is.seek(pos, SEEK_SET);
    if (!next_okay) {
        return false;
    }
    if (token_start == 0) {
        // Can't actually happen...we never start the search at the beginning of the input.
        return false;
    }
    return true;
}